

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTable(UntypedMapBase *this,ClearInput input)

{
  undefined8 destroy_node;
  LogMessage *pLVar1;
  Arena *pAVar2;
  undefined1 auVar3 [16];
  TableEntryPtr local_a8;
  MapNodeSizeInfoT local_9c;
  MapNodeSizeInfoT local_98;
  MapNodeSizeInfoT local_94;
  MapNodeSizeInfoT local_90;
  UntypedMapBase *local_88;
  anon_class_24_2_f7f498b7 loop;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  unsigned_long local_38;
  uint local_2c;
  string *local_28;
  string *absl_log_internal_check_op_result;
  UntypedMapBase *this_local;
  ClearInput input_local;
  
  input_local._0_8_ = input.destroy_node;
  this_local = input._0_8_;
  absl_log_internal_check_op_result = (string *)this;
  local_2c = absl::lts_20240722::log_internal::GetReferenceableValue(this->num_buckets_);
  local_38 = absl::lts_20240722::log_internal::GetReferenceableValue(1);
  local_28 = absl::lts_20240722::log_internal::Check_NEImpl<unsigned_int,unsigned_long>
                       (&local_2c,&local_38,"num_buckets_ != kGlobalEmptyTableSize");
  if (local_28 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.cc"
               ,0x74,auVar3._0_8_,auVar3._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  pAVar2 = MapAllocator<void_*>::arena(&this->alloc_);
  destroy_node = input_local._0_8_;
  if (pAVar2 == (Arena *)0x0) {
    loop.this._0_4_ = this_local._0_4_;
    loop.this._4_4_ = this_local._4_4_;
    loop.input.size_info = input_local.size_info;
    loop.input.destroy_bits = input_local.destroy_bits;
    loop.input.reset_table = input_local.reset_table;
    loop.input._6_2_ = input_local._6_2_;
    local_88 = this;
    input_local._0_8_ = destroy_node;
    switch((ulong)this_local >> 0x20 & 0xff) {
    case 0:
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88);
      break;
    case 1:
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88);
      break;
    case 2:
      local_90 = this_local._0_4_;
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88,this_local._0_4_);
      break;
    case 3:
      local_94 = this_local._0_4_;
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88,this_local._0_4_);
      break;
    case 4:
      local_98 = this_local._0_4_;
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88,this_local._0_4_);
      break;
    case 5:
      local_9c = this_local._0_4_;
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88,this_local._0_4_);
      break;
    case 8:
      ClearTable(google::protobuf::internal::UntypedMapBase::ClearInput)::$_0::operator()
                ((__0 *)&local_88,(_func_void_NodeBase_ptr *)destroy_node);
    }
  }
  if (((ulong)this_local & 0x10000000000) == 0) {
    DeleteTable(this,this->table_,this->num_buckets_);
  }
  else {
    local_a8 = 0;
    std::fill<google::protobuf::internal::TableEntryPtr*,google::protobuf::internal::TableEntryPtr>
              (this->table_,this->table_ + this->num_buckets_,&local_a8);
    this->num_elements_ = 0;
    this->index_of_first_non_null_ = this->num_buckets_;
  }
  return;
}

Assistant:

void UntypedMapBase::ClearTable(const ClearInput input) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (alloc_.arena() == nullptr) {
    const auto loop = [=](auto destroy_node) {
      const TableEntryPtr* table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        NodeBase* node =
            PROTOBUF_PREDICT_FALSE(internal::TableEntryIsTree(table[b]))
                ? DestroyTree(TableEntryToTree(table[b]))
                : TableEntryToNode(table[b]);

        while (node != nullptr) {
          NodeBase* next = node->next;
          destroy_node(node);
          SizedDelete(node, SizeFromInfo(input.size_info));
          node = next;
        }
      }
    };
    switch (input.destroy_bits) {
      case 0:
        loop([](NodeBase*) {});
        break;
      case kKeyIsString:
        loop([](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
        });
        break;
      case kValueIsString:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidValue(size_info))
              ->~basic_string();
        });
        break;
      case kKeyIsString | kValueIsString:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          static_cast<std::string*>(node->GetVoidValue(size_info))
              ->~basic_string();
        });
        break;
      case kValueIsProto:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<MessageLite*>(node->GetVoidValue(size_info))
              ->DestroyInstance();
        });
        break;
      case kKeyIsString | kValueIsProto:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          static_cast<MessageLite*>(node->GetVoidValue(size_info))
              ->DestroyInstance();
        });
        break;
      case kUseDestructFunc:
        loop(input.destroy_node);
        break;
    }
  }

  if (input.reset_table) {
    std::fill(table_, table_ + num_buckets_, TableEntryPtr{});
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}